

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

int __thiscall smf::Options::define(Options *this,string *aDefinition,string *aDescription)

{
  int iVar1;
  
  iVar1 = define(this,aDefinition);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->m_optionRegister).
              super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar1]->description);
  return iVar1;
}

Assistant:

int Options::define(const std::string& aDefinition,
		const std::string& aDescription) {
   int index = define(aDefinition);
   m_optionRegister[index]->setDescription(aDescription);
   return index;
}